

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetItem::setFirstColumnSpanned(QTreeWidgetItem *this,bool span)

{
  byte span_00;
  QTreeModel *this_00;
  byte in_SIL;
  QTreeWidgetItem *in_RDI;
  long in_FS_OFFSET;
  QTreeModel *model;
  QModelIndex index;
  QTreeWidgetItem *in_stack_ffffffffffffffb0;
  QTreeWidgetItem *parent;
  int in_stack_ffffffffffffffcc;
  QTreeView *in_stack_ffffffffffffffd0;
  undefined1 local_20 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  QTreeWidgetItem *local_8;
  
  local_8 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  span_00 = in_SIL & 1;
  parent = in_RDI;
  this_00 = treeModel(in_stack_ffffffffffffffb0,(QTreeWidget *)in_RDI);
  if ((this_00 != (QTreeModel *)0x0) && (in_RDI != this_00->headerItem)) {
    local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QTreeModel::index((QTreeModel *)local_20,(char *)this_00,(int)in_RDI);
    QModelIndex::row((QModelIndex *)local_20);
    QModelIndex::parent((QModelIndex *)this_00);
    QTreeView::setFirstColumnSpanned
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(QModelIndex *)parent,
               (bool)span_00);
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::setFirstColumnSpanned(bool span)
{
    const QTreeModel *model = treeModel();
    if (!model || this == model->headerItem)
        return; // We can't set the header items to spanning
    const QModelIndex index = model->index(this, 0);
    view->setFirstColumnSpanned(index.row(), index.parent(), span);
}